

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_rwlock_tryrdlock(uv_rwlock_t *rwlock)

{
  int iVar1;
  int err;
  uv_rwlock_t *rwlock_local;
  
  iVar1 = pthread_rwlock_tryrdlock((pthread_rwlock_t *)rwlock);
  if (iVar1 == 0) {
    rwlock_local._4_4_ = 0;
  }
  else {
    if ((iVar1 != 0x10) && (iVar1 != 0xb)) {
      abort();
    }
    rwlock_local._4_4_ = -0x10;
  }
  return rwlock_local._4_4_;
}

Assistant:

int uv_rwlock_tryrdlock(uv_rwlock_t* rwlock) {
  int err;

  err = pthread_rwlock_tryrdlock(rwlock);
  if (err) {
    if (err != EBUSY && err != EAGAIN)
      abort();
    return UV_EBUSY;
  }

  return 0;
}